

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_fxrem(sexp ctx,sexp a,sexp_sint_t b)

{
  sexp_uint_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  sexp psVar5;
  undefined8 *puVar6;
  long lVar7;
  uint uVar8;
  sexp_uint_t sVar9;
  
  sVar1 = (a->value).string.offset;
  do {
    sVar9 = sVar1;
    if (sVar9 == 1) {
      iVar2 = 1;
      goto LAB_001191e6;
    }
    sVar1 = sVar9 - 1;
  } while (*(long *)((long)&a->value + sVar9 * 8 + 8) == 0);
  iVar2 = (int)sVar9;
LAB_001191e6:
  if ((b < 1) ||
     (uVar4 = b - ((ulong)b >> 1 & 0x5555555555555555),
     uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
     1 < (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
    lVar7 = -b;
    if (0 < b) {
      lVar7 = b;
    }
    if (b == 0) {
      psVar5 = sexp_xtype_exception(ctx,(sexp)0x0,"divide by zero",a);
      return psVar5;
    }
    if (iVar2 + -1 < 0) {
      lVar3 = 0;
    }
    else {
      puVar6 = (undefined8 *)((long)&a->value + (sVar9 - 1 & 0xffffffff) * 8 + 0x10);
      lVar3 = 0;
      do {
        lVar3 = __umodti3(*puVar6,lVar3,lVar7,0);
        uVar8 = (int)sVar9 - 1;
        sVar9 = (sexp_uint_t)uVar8;
        puVar6 = puVar6 + -1;
      } while (0 < (int)uVar8);
      lVar3 = lVar3 * 2;
    }
    psVar5 = (sexp)((a->value).flonum_bits[0] * lVar3 | 1);
  }
  else {
    psVar5 = (sexp)((b - 1U & (a->value).string.length) * (long)(a->value).flonum_bits[0] * 2 + 1);
  }
  return psVar5;
}

Assistant:

sexp sexp_bignum_fxrem (sexp ctx, sexp a, sexp_sint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, b0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  if (b > 0) {
    q = b - 1;
    if ((b & q) == 0)
      return sexp_make_fixnum(sexp_bignum_sign(a) * (data[0] & q));
  }
  b0 = (b >= 0) ? b : -b;
  if (b0 == 0) {
    return sexp_xtype_exception(ctx, NULL, "divide by zero", a);
  }
  for (i=len-1; i>=0; i--) {
    n = luint_add(luint_shl(n, sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b0));
    n = luint_sub(n, luint_mul_uint(luint_from_uint(q), b0));
  }
  return sexp_make_fixnum(sexp_bignum_sign(a) * (sexp_sint_t)luint_to_uint(n));
}